

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catalog.c
# Opt level: O3

void xmlFreeCatalogHashEntryList(void *payload,xmlChar *name)

{
  undefined8 *puVar1;
  undefined8 *payload_00;
  xmlCatalogEntryPtr catal;
  
  if (payload == (void *)0x0) {
    return;
  }
  payload_00 = *(undefined8 **)((long)payload + 0x10);
  while (payload_00 != (undefined8 *)0x0) {
    puVar1 = (undefined8 *)*payload_00;
    *(undefined4 *)((long)payload_00 + 0x3c) = 0;
    payload_00[2] = 0;
    xmlFreeCatalogEntry(payload_00,name);
    payload_00 = puVar1;
  }
  *(undefined4 *)((long)payload + 0x3c) = 0;
  xmlFreeCatalogEntry(payload,name);
  return;
}

Assistant:

static void
xmlFreeCatalogHashEntryList(void *payload,
                            const xmlChar *name ATTRIBUTE_UNUSED) {
    xmlCatalogEntryPtr catal = (xmlCatalogEntryPtr) payload;
    xmlCatalogEntryPtr children, next;

    if (catal == NULL)
	return;

    children = catal->children;
    while (children != NULL) {
	next = children->next;
	children->dealloc = 0;
	children->children = NULL;
	xmlFreeCatalogEntry(children, NULL);
	children = next;
    }
    catal->dealloc = 0;
    xmlFreeCatalogEntry(catal, NULL);
}